

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict unary_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  short sVar1;
  token_t ptVar2;
  pos_t p;
  pos_t p_00;
  int iVar3;
  size_t sVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_code_t nVar7;
  node *pnVar8;
  pos_t p_01;
  node_code_t code;
  pos_t pos;
  node_code_t local_4c;
  pos_t local_48;
  
  sVar4 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
  pnVar5 = par_type_name(c2m_ctx,1);
  record_stop(c2m_ctx,sVar4,(uint)(pnVar5 == &err_struct));
  ptVar2 = c2m_ctx->parse_ctx->curr_token;
  sVar1 = *(short *)ptVar2;
  if (pnVar5 != &err_struct) {
    if (sVar1 != 0x7b) {
      pnVar6 = unary_expr(c2m_ctx,no_err_p);
      if (pnVar6 == &err_struct) {
        return &err_struct;
      }
      pnVar5 = new_node2(c2m_ctx,N_CAST,pnVar5,pnVar6);
      return pnVar5;
    }
    local_48.fname = (ptVar2->pos).fname;
    local_48.lno = (ptVar2->pos).lno;
    local_48.ln_pos = (ptVar2->pos).ln_pos;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    pnVar6 = initializer_list(c2m_ctx,no_err_p);
    if (pnVar6 == &err_struct) {
      return &err_struct;
    }
    if (*(short *)c2m_ctx->parse_ctx->curr_token != 0x7d) {
      return &err_struct;
    }
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
    p.lno = local_48.lno;
    p.ln_pos = local_48.ln_pos;
    p.fname = local_48.fname;
    pnVar5 = new_node2(c2m_ctx,N_COMPOUND_LITERAL,pnVar5,pnVar6);
    add_pos(c2m_ctx,pnVar5,p);
    pnVar5 = post_expr_part(c2m_ctx,no_err_p,pnVar5);
    return pnVar5;
  }
  if (sVar1 == 0x10c) {
    local_48.fname = (ptVar2->pos).fname;
    local_48.lno = (ptVar2->pos).lno;
    local_48.ln_pos = (ptVar2->pos).ln_pos;
    nVar7 = ptVar2->node_code;
    local_4c = nVar7;
    read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
  }
  else {
    if (sVar1 == 0x112) {
      local_48.fname = (ptVar2->pos).fname;
      local_48.lno = (ptVar2->pos).lno;
      local_48.ln_pos = (ptVar2->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      sVar4 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
      pnVar5 = par_type_name(c2m_ctx,1);
      record_stop(c2m_ctx,sVar4,(uint)(pnVar5 == &err_struct));
      if (pnVar5 == &err_struct) {
        pnVar5 = unary_expr(c2m_ctx,no_err_p);
        if (pnVar5 == &err_struct) {
          return &err_struct;
        }
        pnVar5 = new_node(c2m_ctx,N_IGNORE);
        nVar7 = N_ALIGNOF;
      }
      else {
        nVar7 = N_ALIGNOF;
      }
LAB_0019694c:
      p_01.lno = local_48.lno;
      p_01.ln_pos = local_48.ln_pos;
      p_01.fname = local_48.fname;
      pnVar5 = new_pos_node1(c2m_ctx,nVar7,p_01,pnVar5);
      return pnVar5;
    }
    if (sVar1 == 0x132) {
      local_48.fname = (ptVar2->pos).fname;
      local_48.lno = (ptVar2->pos).lno;
      local_48.ln_pos = (ptVar2->pos).ln_pos;
      read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
      sVar4 = record_start((c2m_ctx_t)c2m_ctx->parse_ctx);
      pnVar5 = par_type_name(c2m_ctx,1);
      record_stop(c2m_ctx,sVar4,(uint)(pnVar5 == &err_struct));
      if (pnVar5 != &err_struct) {
        nVar7 = N_SIZEOF;
        goto LAB_0019694c;
      }
      local_4c = N_EXPR_SIZEOF;
      goto LAB_00196967;
    }
    iVar3 = match(c2m_ctx,0x10e,&local_48,&local_4c,(node_t_conflict *)0x0);
    nVar7 = local_4c;
    if ((((iVar3 == 0) &&
         (iVar3 = match(c2m_ctx,0x106,&local_48,&local_4c,(node_t_conflict *)0x0), nVar7 = local_4c,
         iVar3 == 0)) &&
        (iVar3 = match(c2m_ctx,0x2a,&local_48,&local_4c,(node_t_conflict *)0x0), nVar7 = local_4c,
        iVar3 == 0)) &&
       (iVar3 = match(c2m_ctx,0x26,&local_48,&local_4c,(node_t_conflict *)0x0), nVar7 = local_4c,
       iVar3 == 0)) {
      pnVar5 = post_expr(c2m_ctx,no_err_p);
      return pnVar5;
    }
  }
  if (nVar7 == N_MUL) {
    local_4c = N_DEREF;
  }
  else if (nVar7 == N_AND) {
    local_4c = N_ADDR;
  }
LAB_00196967:
  pnVar5 = unary_expr(c2m_ctx,no_err_p);
  pnVar8 = &err_struct;
  if (pnVar5 != &err_struct) {
    p_00.lno = local_48.lno;
    p_00.ln_pos = local_48.ln_pos;
    p_00.fname = local_48.fname;
    pnVar8 = new_pos_node1(c2m_ctx,local_4c,p_00,pnVar5);
  }
  return pnVar8;
}

Assistant:

D (unary_expr) {
  node_t r, t;
  node_code_t code;
  pos_t pos;

  if ((r = TRY (par_type_name)) != err_node) {
    t = r;
    if (!MP ('{', pos)) {
      P (unary_expr);
      r = new_node2 (c2m_ctx, N_CAST, t, r);
    } else {
      P (initializer_list);
      if (!M ('}')) return err_node;
      r = new_pos_node2 (c2m_ctx, N_COMPOUND_LITERAL, pos, t, r);
      PA (post_expr_part, r);
    }
    return r;
  } else if (MP (T_SIZEOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_SIZEOF, pos, r);
      return r;
    }
    code = N_EXPR_SIZEOF;
  } else if (MP (T_ALIGNOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, r);
    } else {
      P (unary_expr); /* error recovery */
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, new_node (c2m_ctx, N_IGNORE));
    }
    return r;
  } else if (!MC (T_INCDEC, pos, code) && !MC (T_UNOP, pos, code) && !MC (T_ADDOP, pos, code)
             && !MC ('*', pos, code) && !MC ('&', pos, code)) {
    P (post_expr);
    return r;
  } else if (code == N_AND) {
    code = N_ADDR;
  } else if (code == N_MUL) {
    code = N_DEREF;
  }
  P (unary_expr);
  r = new_pos_node1 (c2m_ctx, code, pos, r);
  return r;
}